

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn_factory.h
# Opt level: O3

void __thiscall
iqnet::Serial_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection>::
create_accepted(Serial_conn_factory<iqxmlrpc::(anonymous_namespace)::Https_server_connection> *this,
               Socket *sock)

{
  Reaction_connection *this_00;
  
  this_00 = (Reaction_connection *)operator_new(0x138);
  ssl::Reaction_connection::Reaction_connection(this_00,sock,(Reactor_base *)0x0);
  iqxmlrpc::Server_connection::Server_connection((Server_connection *)(this_00 + 1),&sock->peer);
  (this_00->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler =
       (_func_int **)&PTR__Https_server_connection_0018a0a8;
  this_00[1].super_Connection.super_Connection.super_Event_handler._vptr_Event_handler =
       (_func_int **)&PTR__Https_server_connection_0018a160;
  (*(this->super_Accepted_conn_factory)._vptr_Accepted_conn_factory[3])(this,this_00);
  (*(this_00->super_Connection).super_Connection.super_Event_handler._vptr_Event_handler[10])
            (this_00);
  return;
}

Assistant:

void create_accepted( const Socket& sock )
  {
    Conn_type* c = new Conn_type( sock );
    post_create( c );
    c->post_accept();
  }